

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void fdct4x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  __m128i *palVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar36 [16];
  int iVar43;
  int iVar44;
  int iVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  
  lVar21 = (long)bit;
  auVar22 = ZEXT416((uint)bit);
  iVar35 = LoadMaskz2[lVar21 * 8 + 6][0];
  iVar20 = 1 << ((char)bit - 1U & 0x1f);
  iVar19 = -iVar35;
  iVar28 = (int)(*in)[0];
  iVar29 = *(int *)((long)*in + 4);
  iVar30 = (int)(*in)[1];
  iVar31 = *(int *)((long)*in + 0xc);
  palVar1 = in + col_num * 7;
  iVar37 = (int)(*palVar1)[0];
  iVar38 = *(int *)((long)*palVar1 + 4);
  iVar39 = (int)(*palVar1)[1];
  iVar48 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num;
  iVar60 = (int)(*palVar1)[0];
  iVar61 = *(int *)((long)*palVar1 + 4);
  iVar62 = (int)(*palVar1)[1];
  iVar63 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 6;
  iVar3 = (int)(*palVar1)[0];
  iVar4 = *(int *)((long)*palVar1 + 4);
  iVar5 = (int)(*palVar1)[1];
  iVar6 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 2;
  iVar7 = (int)(*palVar1)[0];
  iVar8 = *(int *)((long)*palVar1 + 4);
  iVar9 = (int)(*palVar1)[1];
  iVar10 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 5;
  iVar11 = (int)(*palVar1)[0];
  iVar12 = *(int *)((long)*palVar1 + 4);
  iVar13 = (int)(*palVar1)[1];
  iVar14 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 3;
  iVar23 = (int)(*palVar1)[0];
  iVar24 = *(int *)((long)*palVar1 + 4);
  iVar25 = (int)(*palVar1)[1];
  iVar26 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + (col_num << 2);
  iVar15 = (int)(*palVar1)[0];
  iVar16 = *(int *)((long)*palVar1 + 4);
  iVar17 = (int)(*palVar1)[1];
  iVar18 = *(int *)((long)*palVar1 + 0xc);
  auVar51._4_4_ = iVar35;
  auVar51._0_4_ = iVar35;
  auVar51._8_4_ = iVar35;
  auVar51._12_4_ = iVar35;
  auVar57._4_4_ = iVar19;
  auVar57._0_4_ = iVar19;
  auVar57._8_4_ = iVar19;
  auVar57._12_4_ = iVar19;
  uVar2 = *(undefined4 *)(&DAT_00b995e0 + lVar21 * 0x20);
  auVar46._4_4_ = uVar2;
  auVar46._0_4_ = uVar2;
  auVar46._8_4_ = uVar2;
  auVar46._12_4_ = uVar2;
  iVar35 = LoadMaskz2[lVar21 * 8 + 4][0];
  auVar50._4_4_ = iVar35;
  auVar50._0_4_ = iVar35;
  auVar50._8_4_ = iVar35;
  auVar50._12_4_ = iVar35;
  iVar19 = iVar37 + iVar28;
  iVar43 = iVar38 + iVar29;
  iVar44 = iVar39 + iVar30;
  iVar45 = iVar48 + iVar31;
  iVar28 = iVar28 - iVar37;
  iVar29 = iVar29 - iVar38;
  iVar30 = iVar30 - iVar39;
  iVar31 = iVar31 - iVar48;
  iVar48 = iVar3 + iVar60;
  iVar52 = iVar4 + iVar61;
  iVar53 = iVar5 + iVar62;
  iVar54 = iVar6 + iVar63;
  auVar33._0_4_ = iVar60 - iVar3;
  auVar33._4_4_ = iVar61 - iVar4;
  auVar33._8_4_ = iVar62 - iVar5;
  auVar33._12_4_ = iVar63 - iVar6;
  iVar35 = iVar11 + iVar7;
  iVar37 = iVar12 + iVar8;
  iVar38 = iVar13 + iVar9;
  iVar39 = iVar14 + iVar10;
  auVar34._0_4_ = iVar7 - iVar11;
  auVar34._4_4_ = iVar8 - iVar12;
  auVar34._8_4_ = iVar9 - iVar13;
  auVar34._12_4_ = iVar10 - iVar14;
  iVar60 = iVar15 + iVar23;
  iVar61 = iVar16 + iVar24;
  iVar62 = iVar17 + iVar25;
  iVar63 = iVar18 + iVar26;
  iVar23 = iVar23 - iVar15;
  iVar24 = iVar24 - iVar16;
  iVar25 = iVar25 - iVar17;
  iVar26 = iVar26 - iVar18;
  auVar58._0_4_ = iVar60 + iVar19;
  auVar58._4_4_ = iVar61 + iVar43;
  auVar58._8_4_ = iVar62 + iVar44;
  auVar58._12_4_ = iVar63 + iVar45;
  auVar40._0_4_ = iVar19 - iVar60;
  auVar40._4_4_ = iVar43 - iVar61;
  auVar40._8_4_ = iVar44 - iVar62;
  auVar40._12_4_ = iVar45 - iVar63;
  auVar27._0_4_ = iVar35 + iVar48;
  auVar27._4_4_ = iVar37 + iVar52;
  auVar27._8_4_ = iVar38 + iVar53;
  auVar27._12_4_ = iVar39 + iVar54;
  auVar49._0_4_ = iVar48 - iVar35;
  auVar49._4_4_ = iVar52 - iVar37;
  auVar49._8_4_ = iVar53 - iVar38;
  auVar49._12_4_ = iVar54 - iVar39;
  auVar36 = pmulld(auVar34,auVar57);
  auVar55 = pmulld(auVar57,auVar33);
  auVar32 = pmulld(auVar33,auVar51);
  uVar2 = *(undefined4 *)(&DAT_00b99600 + lVar21 * 0x20);
  auVar56._4_4_ = uVar2;
  auVar56._0_4_ = uVar2;
  auVar56._8_4_ = uVar2;
  auVar56._12_4_ = uVar2;
  auVar33 = pmulld(auVar34,auVar51);
  auVar57 = pmulld(auVar58,auVar51);
  auVar27 = pmulld(auVar27,auVar51);
  auVar34 = pmulld(auVar49,auVar46);
  auVar58 = pmulld(auVar40,auVar50);
  iVar35 = LoadMaskz2[lVar21 * 8 + 3][0];
  auVar59._4_4_ = iVar35;
  auVar59._0_4_ = iVar35;
  auVar59._8_4_ = iVar35;
  auVar59._12_4_ = iVar35;
  auVar40 = pmulld(auVar40,auVar46);
  iVar35 = LoadMaskz2[lVar21 * 8 + 5][0];
  iVar37 = auVar32._0_4_ + iVar20 + auVar36._0_4_ >> auVar22;
  iVar38 = auVar32._4_4_ + iVar20 + auVar36._4_4_ >> auVar22;
  iVar39 = auVar32._8_4_ + iVar20 + auVar36._8_4_ >> auVar22;
  iVar48 = auVar32._12_4_ + iVar20 + auVar36._12_4_ >> auVar22;
  iVar60 = (iVar20 - auVar55._0_4_) + auVar33._0_4_ >> auVar22;
  iVar61 = (iVar20 - auVar55._4_4_) + auVar33._4_4_ >> auVar22;
  iVar62 = (iVar20 - auVar55._8_4_) + auVar33._8_4_ >> auVar22;
  iVar63 = (iVar20 - auVar55._12_4_) + auVar33._12_4_ >> auVar22;
  auVar50 = pmulld(auVar49,auVar50);
  auVar41._0_4_ = iVar23 + iVar37;
  auVar41._4_4_ = iVar24 + iVar38;
  auVar41._8_4_ = iVar25 + iVar39;
  auVar41._12_4_ = iVar26 + iVar48;
  auVar32._0_4_ = iVar23 - iVar37;
  auVar32._4_4_ = iVar24 - iVar38;
  auVar32._8_4_ = iVar25 - iVar39;
  auVar32._12_4_ = iVar26 - iVar48;
  auVar36._0_4_ = iVar28 - iVar60;
  auVar36._4_4_ = iVar29 - iVar61;
  auVar36._8_4_ = iVar30 - iVar62;
  auVar36._12_4_ = iVar31 - iVar63;
  auVar55._0_4_ = iVar60 + iVar28;
  auVar55._4_4_ = iVar61 + iVar29;
  auVar55._8_4_ = iVar62 + iVar30;
  auVar55._12_4_ = iVar63 + iVar31;
  auVar33 = pmulld(auVar41,auVar56);
  auVar51 = pmulld(auVar55,auVar59);
  iVar28 = LoadMaskz2[lVar21 * 8 + 7][0];
  palVar1 = out + col_num;
  *(int *)*palVar1 = auVar33._0_4_ + iVar20 + auVar51._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = auVar33._4_4_ + iVar20 + auVar51._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = auVar33._8_4_ + iVar20 + auVar51._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = auVar33._12_4_ + iVar20 + auVar51._12_4_ >> auVar22;
  auVar33 = pmulld(auVar55,auVar56);
  auVar51 = pmulld(auVar41,auVar59);
  auVar42._4_4_ = iVar35;
  auVar42._0_4_ = iVar35;
  auVar42._8_4_ = iVar35;
  auVar42._12_4_ = iVar35;
  auVar47._4_4_ = iVar28;
  auVar47._0_4_ = iVar28;
  auVar47._8_4_ = iVar28;
  auVar47._12_4_ = iVar28;
  palVar1 = out + col_num * 7;
  *(int *)*palVar1 = (iVar20 - auVar51._0_4_) + auVar33._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = (iVar20 - auVar51._4_4_) + auVar33._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = (iVar20 - auVar51._8_4_) + auVar33._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = (iVar20 - auVar51._12_4_) + auVar33._12_4_ >> auVar22;
  auVar33 = pmulld(auVar32,auVar42);
  auVar51 = pmulld(auVar36,auVar47);
  palVar1 = out + col_num * 5;
  *(int *)*palVar1 = auVar33._0_4_ + iVar20 + auVar51._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = auVar33._4_4_ + iVar20 + auVar51._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = auVar33._8_4_ + iVar20 + auVar51._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = auVar33._12_4_ + iVar20 + auVar51._12_4_ >> auVar22;
  auVar33 = pmulld(auVar36,auVar42);
  auVar32 = pmulld(auVar32,auVar47);
  palVar1 = out + col_num * 3;
  *(int *)*palVar1 = (iVar20 - auVar32._0_4_) + auVar33._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = (iVar20 - auVar32._4_4_) + auVar33._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = (iVar20 - auVar32._8_4_) + auVar33._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = (iVar20 - auVar32._12_4_) + auVar33._12_4_ >> auVar22;
  *(int *)*out = auVar27._0_4_ + iVar20 + auVar57._0_4_ >> auVar22;
  *(int *)((long)*out + 4) = auVar27._4_4_ + iVar20 + auVar57._4_4_ >> auVar22;
  *(int *)(*out + 1) = auVar27._8_4_ + iVar20 + auVar57._8_4_ >> auVar22;
  *(int *)((long)*out + 0xc) = auVar27._12_4_ + iVar20 + auVar57._12_4_ >> auVar22;
  palVar1 = out + (col_num << 2);
  *(int *)*palVar1 = (iVar20 - auVar27._0_4_) + auVar57._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = (iVar20 - auVar27._4_4_) + auVar57._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = (iVar20 - auVar27._8_4_) + auVar57._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = (iVar20 - auVar27._12_4_) + auVar57._12_4_ >> auVar22;
  palVar1 = out + col_num * 2;
  *(int *)*palVar1 = auVar34._0_4_ + iVar20 + auVar58._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = auVar34._4_4_ + iVar20 + auVar58._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = auVar34._8_4_ + iVar20 + auVar58._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = auVar34._12_4_ + iVar20 + auVar58._12_4_ >> auVar22;
  palVar1 = out + col_num * 6;
  *(int *)*palVar1 = (iVar20 - auVar50._0_4_) + auVar40._0_4_ >> auVar22;
  *(int *)((long)*palVar1 + 4) = (iVar20 - auVar50._4_4_) + auVar40._4_4_ >> auVar22;
  *(int *)(*palVar1 + 1) = (iVar20 - auVar50._8_4_) + auVar40._8_4_ >> auVar22;
  *(int *)((long)*palVar1 + 0xc) = (iVar20 - auVar50._12_4_) + auVar40._12_4_ >> auVar22;
  return;
}

Assistant:

static void fdct4x8_sse4_1(__m128i *in, __m128i *out, int bit,
                           const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i u[8], v[8];

  int startidx = 0 * col_num;
  int endidx = 7 * col_num;
  // Even 8 points 0, 2, ..., 14
  // stage 0
  // stage 1
  u[0] = _mm_add_epi32(in[startidx], in[endidx]);
  v[7] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[7]
  startidx += col_num;
  endidx -= col_num;
  u[1] = _mm_add_epi32(in[startidx], in[endidx]);
  u[6] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[2] = _mm_add_epi32(in[startidx], in[endidx]);
  u[5] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[3] = _mm_add_epi32(in[startidx], in[endidx]);
  v[4] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[4]

  // stage 2
  v[0] = _mm_add_epi32(u[0], u[3]);
  v[3] = _mm_sub_epi32(u[0], u[3]);
  v[1] = _mm_add_epi32(u[1], u[2]);
  v[2] = _mm_sub_epi32(u[1], u[2]);

  v[5] = _mm_mullo_epi32(u[5], cospim32);
  v[6] = _mm_mullo_epi32(u[6], cospi32);
  v[5] = _mm_add_epi32(v[5], v[6]);
  v[5] = _mm_add_epi32(v[5], rnding);
  v[5] = _mm_srai_epi32(v[5], bit);

  u[0] = _mm_mullo_epi32(u[5], cospi32);
  v[6] = _mm_mullo_epi32(u[6], cospim32);
  v[6] = _mm_sub_epi32(u[0], v[6]);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  // stage 3
  // type 0
  v[0] = _mm_mullo_epi32(v[0], cospi32);
  v[1] = _mm_mullo_epi32(v[1], cospi32);
  u[0] = _mm_add_epi32(v[0], v[1]);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_sub_epi32(v[0], v[1]);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // type 1
  v[0] = _mm_mullo_epi32(v[2], cospi48);
  v[1] = _mm_mullo_epi32(v[3], cospi16);
  u[2] = _mm_add_epi32(v[0], v[1]);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  v[0] = _mm_mullo_epi32(v[2], cospi16);
  v[1] = _mm_mullo_epi32(v[3], cospi48);
  u[3] = _mm_sub_epi32(v[1], v[0]);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  u[4] = _mm_add_epi32(v[4], v[5]);
  u[5] = _mm_sub_epi32(v[4], v[5]);
  u[6] = _mm_sub_epi32(v[7], v[6]);
  u[7] = _mm_add_epi32(v[7], v[6]);

  // stage 4
  // stage 5
  v[0] = _mm_mullo_epi32(u[4], cospi56);
  v[1] = _mm_mullo_epi32(u[7], cospi8);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[1 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[4]

  v[0] = _mm_mullo_epi32(u[4], cospi8);
  v[1] = _mm_mullo_epi32(u[7], cospi56);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[7 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[7]

  v[0] = _mm_mullo_epi32(u[5], cospi24);
  v[1] = _mm_mullo_epi32(u[6], cospi40);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[5 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[5]

  v[0] = _mm_mullo_epi32(u[5], cospi40);
  v[1] = _mm_mullo_epi32(u[6], cospi24);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[3 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[6]

  out[0 * col_num] = u[0];  // buf0[0]
  out[4 * col_num] = u[1];  // buf0[1]
  out[2 * col_num] = u[2];  // buf0[2]
  out[6 * col_num] = u[3];  // buf0[3]
}